

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O0

void writeOldRawSolution(FILE *file,HighsLogOptions *log_options,HighsLp *lp,HighsBasis *basis,
                        HighsSolution *solution)

{
  reference pvVar1;
  reference pvVar2;
  byte *in_RCX;
  uint *in_RDX;
  string *in_RSI;
  byte *in_R8;
  HighsInt iRow;
  HighsInt iCol;
  stringstream ss;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> use_row_status;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> use_col_status;
  vector<double,_std::allocator<double>_> use_row_dual;
  vector<double,_std::allocator<double>_> use_col_dual;
  vector<double,_std::allocator<double>_> use_row_value;
  vector<double,_std::allocator<double>_> use_col_value;
  bool have_basis;
  bool have_dual;
  bool have_value;
  string *in_stack_fffffffffffff8a0;
  string *s;
  HighsLogOptions *in_stack_fffffffffffff8a8;
  HighsLogOptions *log_options_;
  FILE *in_stack_fffffffffffff8b0;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *in_stack_fffffffffffff938;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *in_stack_fffffffffffff940;
  string local_628 [32];
  string local_608 [32];
  string local_5e8 [32];
  string local_5c8 [32];
  string local_5a8 [32];
  string local_588 [32];
  int local_568;
  allocator local_561;
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  int local_480;
  allocator local_479;
  string local_478 [32];
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  stringstream local_278 [16];
  stringstream local_268 [16];
  string local_f0 [32];
  undefined4 local_d0;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_c0;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_a8;
  vector<double,_std::allocator<double>_> local_90;
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  byte local_2b;
  byte local_2a;
  byte local_29;
  uint *local_18;
  string *local_10;
  
  local_29 = *in_R8 & 1;
  local_2a = in_R8[1] & 1;
  local_2b = *in_RCX & 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x50c076);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x50c083);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x50c090);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x50c09d);
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::vector
            ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)0x50c0aa);
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::vector
            ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)0x50c0b7);
  if ((local_29 & 1) != 0) {
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff940,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff938);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff940,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff938);
  }
  if ((local_2a & 1) != 0) {
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff940,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff938);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff940,
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff938);
  }
  if ((local_2b & 1) != 0) {
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator=
              (in_stack_fffffffffffff940,in_stack_fffffffffffff938);
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator=
              (in_stack_fffffffffffff940,in_stack_fffffffffffff938);
  }
  if ((((local_29 & 1) == 0) && ((local_2a & 1) == 0)) && ((local_2b & 1) == 0)) {
    local_d0 = 1;
  }
  else {
    highsFormatToString_abi_cxx11_
              ((char *)local_f0,
               "%d %d : Number of columns and rows for primal or dual solution or basis\n",
               (ulong)*local_18,(ulong)local_18[1]);
    highsFprintfString(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0
                      );
    std::__cxx11::string::~string(local_f0);
    std::__cxx11::stringstream::stringstream(local_278);
    std::__cxx11::string::string(local_298);
    std::__cxx11::stringstream::str((string *)local_278);
    std::__cxx11::string::~string(local_298);
    if ((local_29 & 1) == 0) {
      highsFormatToString_abi_cxx11_((char *)local_2d8,"F");
      std::operator<<((ostream *)(local_278 + 0x10),local_2d8);
      std::__cxx11::string::~string(local_2d8);
    }
    else {
      highsFormatToString_abi_cxx11_((char *)local_2b8,"T");
      std::operator<<((ostream *)(local_278 + 0x10),local_2b8);
      std::__cxx11::string::~string(local_2b8);
    }
    highsFormatToString_abi_cxx11_((char *)local_2f8," Primal solution\n");
    std::operator<<((ostream *)(local_278 + 0x10),local_2f8);
    std::__cxx11::string::~string(local_2f8);
    std::__cxx11::stringstream::str();
    highsFprintfString(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0
                      );
    std::__cxx11::string::~string(local_318);
    std::__cxx11::string::string(local_338);
    std::__cxx11::stringstream::str((string *)local_278);
    std::__cxx11::string::~string(local_338);
    if ((local_2a & 1) == 0) {
      highsFormatToString_abi_cxx11_((char *)local_378,"F");
      std::operator<<((ostream *)(local_278 + 0x10),local_378);
      std::__cxx11::string::~string(local_378);
    }
    else {
      highsFormatToString_abi_cxx11_((char *)local_358,"T");
      std::operator<<((ostream *)(local_278 + 0x10),local_358);
      std::__cxx11::string::~string(local_358);
    }
    highsFormatToString_abi_cxx11_((char *)local_398," Dual solution\n");
    std::operator<<((ostream *)(local_278 + 0x10),local_398);
    std::__cxx11::string::~string(local_398);
    std::__cxx11::stringstream::str();
    highsFprintfString(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0
                      );
    std::__cxx11::string::~string(local_3b8);
    std::__cxx11::string::string(local_3d8);
    std::__cxx11::stringstream::str((string *)local_278);
    std::__cxx11::string::~string(local_3d8);
    if ((local_2b & 1) == 0) {
      highsFormatToString_abi_cxx11_((char *)local_418,"F");
      std::operator<<((ostream *)(local_278 + 0x10),local_418);
      std::__cxx11::string::~string(local_418);
    }
    else {
      highsFormatToString_abi_cxx11_((char *)local_3f8,"T");
      std::operator<<((ostream *)(local_278 + 0x10),local_3f8);
      std::__cxx11::string::~string(local_3f8);
    }
    highsFormatToString_abi_cxx11_((char *)local_438," Basis\n");
    std::operator<<((ostream *)(local_278 + 0x10),local_438);
    std::__cxx11::string::~string(local_438);
    std::__cxx11::stringstream::str();
    highsFprintfString(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0
                      );
    std::__cxx11::string::~string(local_458);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_478,"Columns\n",&local_479);
    highsFprintfString(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0
                      );
    std::__cxx11::string::~string(local_478);
    std::allocator<char>::~allocator((allocator<char> *)&local_479);
    for (local_480 = 0; local_480 < (int)*local_18; local_480 = local_480 + 1) {
      std::__cxx11::string::string(local_4a0);
      std::__cxx11::stringstream::str((string *)local_278);
      std::__cxx11::string::~string(local_4a0);
      if ((local_29 & 1) != 0) {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&local_48,(long)local_480)
        ;
        highsFormatToString_abi_cxx11_((char *)*pvVar1,local_4c0,"%.15g ");
        std::operator<<((ostream *)(local_278 + 0x10),local_4c0);
        std::__cxx11::string::~string(local_4c0);
      }
      if ((local_2a & 1) != 0) {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&local_78,(long)local_480)
        ;
        highsFormatToString_abi_cxx11_((char *)*pvVar1,local_4e0,"%.15g ");
        std::operator<<((ostream *)(local_278 + 0x10),local_4e0);
        std::__cxx11::string::~string(local_4e0);
      }
      if ((local_2b & 1) != 0) {
        pvVar2 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           (&local_a8,(long)local_480);
        highsFormatToString_abi_cxx11_((char *)local_500,"%d",(ulong)*pvVar2);
        std::operator<<((ostream *)(local_278 + 0x10),local_500);
        std::__cxx11::string::~string(local_500);
      }
      highsFormatToString_abi_cxx11_((char *)local_520,"\n");
      std::operator<<((ostream *)(local_278 + 0x10),local_520);
      std::__cxx11::string::~string(local_520);
      std::__cxx11::stringstream::str();
      highsFprintfString(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,
                         in_stack_fffffffffffff8a0);
      std::__cxx11::string::~string(local_540);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_560,"Rows\n",&local_561);
    highsFprintfString(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0
                      );
    std::__cxx11::string::~string(local_560);
    std::allocator<char>::~allocator((allocator<char> *)&local_561);
    for (local_568 = 0; local_568 < (int)local_18[1]; local_568 = local_568 + 1) {
      std::__cxx11::string::string(local_588);
      std::__cxx11::stringstream::str((string *)local_278);
      std::__cxx11::string::~string(local_588);
      if ((local_29 & 1) != 0) {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&local_60,(long)local_568)
        ;
        highsFormatToString_abi_cxx11_((char *)*pvVar1,local_5a8,"%.15g ");
        std::operator<<((ostream *)(local_278 + 0x10),local_5a8);
        std::__cxx11::string::~string(local_5a8);
      }
      if ((local_2a & 1) != 0) {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,(long)local_568)
        ;
        highsFormatToString_abi_cxx11_((char *)*pvVar1,local_5c8,"%.15g ");
        std::operator<<((ostream *)(local_278 + 0x10),local_5c8);
        std::__cxx11::string::~string(local_5c8);
      }
      if ((local_2b & 1) != 0) {
        in_stack_fffffffffffff8b0 = (FILE *)(local_278 + 0x10);
        pvVar2 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           (&local_c0,(long)local_568);
        highsFormatToString_abi_cxx11_((char *)local_5e8,"%d",(ulong)*pvVar2);
        std::operator<<((ostream *)in_stack_fffffffffffff8b0,local_5e8);
        std::__cxx11::string::~string(local_5e8);
      }
      log_options_ = (HighsLogOptions *)(local_278 + 0x10);
      highsFormatToString_abi_cxx11_((char *)local_608,"\n");
      std::operator<<((ostream *)log_options_,local_608);
      std::__cxx11::string::~string(local_608);
      s = local_10;
      std::__cxx11::stringstream::str();
      highsFprintfString(in_stack_fffffffffffff8b0,log_options_,s);
      std::__cxx11::string::~string(local_628);
    }
    std::__cxx11::stringstream::~stringstream(local_278);
    local_d0 = 0;
  }
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::~vector
            ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
             in_stack_fffffffffffff8b0);
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::~vector
            ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
             in_stack_fffffffffffff8b0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff8b0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff8b0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff8b0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff8b0);
  return;
}

Assistant:

void writeOldRawSolution(FILE* file, const HighsLogOptions& log_options,
                         const HighsLp& lp, const HighsBasis& basis,
                         const HighsSolution& solution) {
  const bool have_value = solution.value_valid;
  const bool have_dual = solution.dual_valid;
  const bool have_basis = basis.valid;
  vector<double> use_col_value;
  vector<double> use_row_value;
  vector<double> use_col_dual;
  vector<double> use_row_dual;
  vector<HighsBasisStatus> use_col_status;
  vector<HighsBasisStatus> use_row_status;
  if (have_value) {
    use_col_value = solution.col_value;
    use_row_value = solution.row_value;
  }
  if (have_dual) {
    use_col_dual = solution.col_dual;
    use_row_dual = solution.row_dual;
  }
  if (have_basis) {
    use_col_status = basis.col_status;
    use_row_status = basis.row_status;
  }
  if (!have_value && !have_dual && !have_basis) return;
  highsFprintfString(
      file, log_options,
      highsFormatToString(
          "%" HIGHSINT_FORMAT " %" HIGHSINT_FORMAT
          " : Number of columns and rows for primal or dual solution "
          "or basis\n",
          lp.num_col_, lp.num_row_));
  std::stringstream ss;
  ss.str(std::string());
  if (have_value) {
    ss << highsFormatToString("T");
  } else {
    ss << highsFormatToString("F");
  }
  ss << highsFormatToString(" Primal solution\n");
  highsFprintfString(file, log_options, ss.str());
  ss.str(std::string());
  if (have_dual) {
    ss << highsFormatToString("T");
  } else {
    ss << highsFormatToString("F");
  }
  ss << highsFormatToString(" Dual solution\n");
  highsFprintfString(file, log_options, ss.str());
  ss.str(std::string());
  if (have_basis) {
    ss << highsFormatToString("T");
  } else {
    ss << highsFormatToString("F");
  }
  ss << highsFormatToString(" Basis\n");
  highsFprintfString(file, log_options, ss.str());
  highsFprintfString(file, log_options, "Columns\n");
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    ss.str(std::string());
    if (have_value) ss << highsFormatToString("%.15g ", use_col_value[iCol]);
    if (have_dual) ss << highsFormatToString("%.15g ", use_col_dual[iCol]);
    if (have_basis)
      ss << highsFormatToString("%" HIGHSINT_FORMAT "",
                                (HighsInt)use_col_status[iCol]);
    ss << highsFormatToString("\n");
    highsFprintfString(file, log_options, ss.str());
  }
  highsFprintfString(file, log_options, "Rows\n");
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    ss.str(std::string());
    if (have_value) ss << highsFormatToString("%.15g ", use_row_value[iRow]);
    if (have_dual) ss << highsFormatToString("%.15g ", use_row_dual[iRow]);
    if (have_basis)
      ss << highsFormatToString("%" HIGHSINT_FORMAT "",
                                (HighsInt)use_row_status[iRow]);
    ss << highsFormatToString("\n");
    highsFprintfString(file, log_options, ss.str());
  }
}